

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O0

FSerializer * Serialize(FSerializer *arc,char *key,FSectorPortal *port,FSectorPortal *def)

{
  bool bVar1;
  FSerializer *pFVar2;
  FSectorPortal *def_local;
  FSectorPortal *port_local;
  char *key_local;
  FSerializer *arc_local;
  
  bVar1 = FSerializer::BeginObject(arc,key);
  if (bVar1) {
    pFVar2 = FSerializer::operator()(arc,"type",&port->mType);
    pFVar2 = FSerializer::operator()(pFVar2,"flags",&port->mFlags);
    pFVar2 = FSerializer::operator()(pFVar2,"partner",&port->mPartner);
    pFVar2 = FSerializer::operator()(pFVar2,"plane",&port->mPlane);
    pFVar2 = FSerializer::operator()(pFVar2,"origin",&port->mOrigin);
    pFVar2 = FSerializer::operator()(pFVar2,"destination",&port->mDestination);
    pFVar2 = FSerializer::operator()(pFVar2,"displacement",&port->mDisplacement);
    pFVar2 = FSerializer::operator()(pFVar2,"planez",&port->mPlaneZ);
    pFVar2 = FSerializer::operator()(pFVar2,"skybox",&port->mSkybox);
    FSerializer::EndObject(pFVar2);
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FSectorPortal &port, FSectorPortal *def)
{
	if (arc.BeginObject(key))
	{
		arc("type", port.mType)
			("flags", port.mFlags)
			("partner", port.mPartner)
			("plane", port.mPlane)
			("origin", port.mOrigin)
			("destination", port.mDestination)
			("displacement", port.mDisplacement)
			("planez", port.mPlaneZ)
			("skybox", port.mSkybox)
			.EndObject();
	}
	return arc;
}